

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue::Provide::~Provide
          (Provide *this)

{
  uint uVar1;
  PromiseFulfiller<void> *pPVar2;
  char (*in_RCX) [117];
  String local_1e8;
  Exception local_1d0;
  Entry *local_40;
  Entry *e;
  Entry *__end3;
  Entry *local_20;
  Entry *__begin3;
  HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>
  *__range3;
  Provide *this_local;
  
  __begin3 = (Entry *)&this->embargoes;
  __range3 = (HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>
              *)this;
  local_20 = kj::
             HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>
             ::begin((HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>
                      *)__begin3);
  e = kj::
      HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>
      ::end((HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>
             *)__begin3);
  for (; local_20 != e; local_20 = (Entry *)&local_20[1].value.ptr) {
    local_40 = local_20;
    pPVar2 = kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->
                       ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)
                        &local_20[1].key.content.size_);
    uVar1 = (*(pPVar2->super_PromiseRejector)._vptr_PromiseRejector[1])();
    if ((uVar1 & 1) != 0) {
      pPVar2 = kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->
                         ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)
                          &local_40[1].key.content.size_);
      kj::_::Debug::makeDescription<char_const(&)[117]>
                (&local_1e8,
                 (Debug *)
                 "\"Three-party handoff failed because a connection was lost along the introducing \" \"route before the embargo could clear.\""
                 ,
                 "Three-party handoff failed because a connection was lost along the introducing route before the embargo could clear."
                 ,in_RCX);
      in_RCX = (char (*) [117])0x1106;
      kj::Exception::Exception
                (&local_1d0,DISCONNECTED,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0x1106,&local_1e8);
      (**(pPVar2->super_PromiseRejector)._vptr_PromiseRejector)(pPVar2,&local_1d0);
      kj::Exception::~Exception(&local_1d0);
      kj::String::~String(&local_1e8);
    }
  }
  kj::
  HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>
  ::~HashMap(&this->embargoes);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own(&this->client);
  return;
}

Assistant:

~Provide() noexcept(false) {
        for (auto& e: embargoes) {
          if (e.value.fulfiller->isWaiting()) {
            e.value.fulfiller->reject(KJ_EXCEPTION(DISCONNECTED,
                "Three-party handoff failed because a connection was lost along the introducing "
                "route before the embargo could clear."));
          }
        }
      }